

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O2

void int_rel_half_reif_real(IntVar *x,IntRelType t,int c,BoolView *r)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  IntVar *y;
  BoolView *z;
  BoolView *y_00;
  BoolView *x_00;
  bool bVar5;
  int iVar6;
  int in_stack_fffffffffffffe7c;
  Lit local_17c;
  vec<Lit> local_178;
  vec<Lit> local_168;
  BoolView local_150;
  BoolView local_140;
  BoolView local_130;
  BoolView local_120;
  BoolView local_110;
  BoolView local_100;
  BoolView local_f0;
  BoolView local_e0;
  BoolView local_d0;
  BoolView local_c0;
  BoolView local_b0;
  BoolView local_a0;
  BoolView local_90;
  BoolView local_80;
  BoolView local_70;
  BoolView local_60;
  BoolView local_50;
  BoolView local_40;
  
  bVar1 = BoolView::isFalse(r);
  if (bVar1) {
    return;
  }
  bVar1 = BoolView::isTrue(r);
  if ((t == IRT_NE && bVar1) &&
     (iVar2 = (*(x->super_Var).super_Branching._vptr_Branching[3])(x), iVar2 == 2)) {
    bVar1 = IntVar::indomain(x,(long)c);
    if (!bVar1) {
      return;
    }
    iVar2 = (*(x->super_Var).super_Branching._vptr_Branching[0x11])(x,(long)c,0,1);
    if ((char)iVar2 != '\0') {
      return;
    }
    puts("=====UNSATISFIABLE=====");
    printf("%% Top level failure!\n");
    exit(0);
  }
  iVar2 = (*(x->super_Var).super_Branching._vptr_Branching[3])(x);
  if (iVar2 == 1) {
    y = getConstant(in_stack_fffffffffffffe7c);
    int_rel_half_reif(x,t,y,r,0);
    return;
  }
  uVar3 = (*(x->super_Var).super_Branching._vptr_Branching[0xd])(x,(long)c,2);
  uVar4 = (*(x->super_Var).super_Branching._vptr_Branching[0xd])(x,(long)c,3);
  if (IRT_GT < t) {
    fprintf(_stderr,"%s:%d: ","binary.cpp",0x20e);
    fwrite("Assertion failed.\n",0x12,1,_stderr);
    abort();
  }
  iVar6 = (int)uVar3 >> 1;
  bVar5 = (bool)((byte)uVar3 & 1);
  iVar2 = (int)uVar4 >> 1;
  bVar1 = (bool)((byte)uVar4 & 1);
  switch(t) {
  case IRT_EQ:
    local_40.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
    local_50.v = r->v;
    local_50.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
    local_50.s = (bool)(r->s ^ 1);
    local_60.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
    local_60.v = bv_true.v;
    local_60.s = bv_true.s;
    local_40.v = iVar2;
    local_40.s = bVar1;
    bool_rel(&local_40,BRT_OR,&local_50,&local_60);
    x_00 = &local_70;
    local_70.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
    local_80.v = r->v;
    y_00 = &local_80;
    local_80.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
    local_80.s = (bool)(r->s ^ 1);
    z = &local_90;
    local_90.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
    local_70.v = iVar6;
    local_70.s = bVar5;
    goto LAB_0018fb62;
  case IRT_NE:
    local_168.sz = 0;
    local_168.cap = 0;
    local_168.data = (Lit *)0x0;
    local_178.sz = (uint)(bVar5 ^ 1) | uVar3 & 0xfffffffe;
    vec<Lit>::push(&local_168,(Lit *)&local_178);
    local_178.sz = (uint)(bVar1 ^ 1) | uVar4 & 0xfffffffe;
    vec<Lit>::push(&local_168,(Lit *)&local_178);
    local_178.sz = (r->s ^ 1) + r->v * 2;
    vec<Lit>::push(&local_168,(Lit *)&local_178);
    SAT::addClause(&sat,&local_168,false);
    local_178.sz = 0;
    local_178.cap = 0;
    local_178.data = (Lit *)0x0;
    local_17c.x = uVar3;
    vec<Lit>::push(&local_178,&local_17c);
    local_17c.x = uVar4;
    vec<Lit>::push(&local_178,&local_17c);
    local_17c.x = (r->s ^ 1) + r->v * 2;
    vec<Lit>::push(&local_178,&local_17c);
    SAT::addClause(&sat,&local_178,false);
    free(local_178.data);
    free(local_168.data);
    return;
  case IRT_LE:
    x_00 = &local_a0;
    local_a0.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
    local_b0.v = r->v;
    y_00 = &local_b0;
    local_b0.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
    local_b0.s = (bool)(r->s ^ 1);
    z = &local_c0;
    local_a0.v = iVar2;
    local_a0.s = bVar1;
    break;
  case IRT_LT:
    x_00 = &local_d0;
    local_d0.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
    local_d0.s = (bool)(bVar5 ^ 1);
    local_e0.v = r->v;
    y_00 = &local_e0;
    local_e0.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
    local_e0.s = (bool)(r->s ^ 1);
    z = &local_f0;
    local_d0.v = iVar6;
    goto LAB_0018fa1d;
  case IRT_GE:
    x_00 = &local_100;
    local_100.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
    local_110.v = r->v;
    y_00 = &local_110;
    local_110.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
    local_110.s = (bool)(r->s ^ 1);
    z = &local_120;
    local_100.v = iVar6;
    local_100.s = bVar5;
LAB_0018fa1d:
    (z->super_Var).super_Branching._vptr_Branching = (_func_int **)&PTR_finished_001efbb8;
    goto LAB_0018fb62;
  case IRT_GT:
    x_00 = &local_130;
    local_130.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
    local_130.s = (bool)(bVar1 ^ 1);
    local_140.v = r->v;
    y_00 = &local_140;
    local_140.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
    local_140.s = (bool)(r->s ^ 1);
    z = &local_150;
    local_130.v = iVar2;
  }
  (z->super_Var).super_Branching._vptr_Branching = (_func_int **)&PTR_finished_001efbb8;
LAB_0018fb62:
  z->v = bv_true.v;
  z->s = bv_true.s;
  bool_rel(x_00,BRT_OR,y_00,z);
  return;
}

Assistant:

void int_rel_half_reif_real(IntVar* x, IntRelType t, int c, BoolView r) {
	if (r.isFalse()) {
		return;
	}
	if (r.isTrue() && t == IRT_NE && x->getType() == INT_VAR_EL) {
		TL_SET(x, remVal, c);
		return;
	}
	if (x->getType() == INT_VAR) {
		assert(!so.lazy);
		IntVar* v = getConstant(c);
		int_rel_half_reif(x, t, v, r);
		return;
	}
	BoolView b1(x->getLit(c, LR_GE));
	BoolView b2(x->getLit(c, LR_LE));
	switch (t) {
		case IRT_EQ:
			bool_rel(b2, BRT_OR, ~r);
			bool_rel(b1, BRT_OR, ~r);
			break;
		case IRT_NE: {
			vec<Lit> ps1;
			ps1.push(~b1);
			ps1.push(~b2);
			ps1.push(~r);
			sat.addClause(ps1);
			vec<Lit> ps2;
			ps2.push(b1);
			ps2.push(b2);
			ps2.push(~r);
			sat.addClause(ps2);
		} break;
		case IRT_LE:
			bool_rel(b2, BRT_OR, ~r);
			break;
		case IRT_LT:
			bool_rel(~b1, BRT_OR, ~r);
			break;
		case IRT_GE:
			bool_rel(b1, BRT_OR, ~r);
			break;
		case IRT_GT:
			bool_rel(~b2, BRT_OR, ~r);
			break;
		default:
			NEVER;
	}
}